

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O0

bool __thiscall
blcl::net::tsqueue<blcl::net::owned_message<MsgType>_>::empty
          (tsqueue<blcl::net::owned_message<MsgType>_> *this)

{
  bool bVar1;
  scoped_lock<std::mutex> local_18;
  scoped_lock<std::mutex> lock;
  tsqueue<blcl::net::owned_message<MsgType>_> *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::scoped_lock<std::mutex>::scoped_lock(&local_18,&this->queue_mtx_);
  bVar1 = std::
          deque<blcl::net::owned_message<MsgType>,_std::allocator<blcl::net::owned_message<MsgType>_>_>
          ::empty(&this->raw_deque_);
  std::scoped_lock<std::mutex>::~scoped_lock(&local_18);
  return bVar1;
}

Assistant:

bool empty() {
            std::scoped_lock lock(queue_mtx_);
            return raw_deque_.empty();
        }